

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O2

CompilationOptions * __thiscall slang::Bag::insertOrGet<slang::ast::CompilationOptions>(Bag *this)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  size_t hash;
  CompilationOptions *pCVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  value_type_pointer __rhs;
  ulong pos0;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  try_emplace_args_t local_91;
  type_index local_90;
  ulong local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_90._M_target = (type_info *)&ast::CompilationOptions::typeinfo;
  hash = boost::unordered::detail::foa::mulx_mix::
         mix<slang::hash<std::type_index,void>,std::type_index>
                   ((hash<std::type_index,_void> *)this,&local_90);
  pos0 = hash >> ((byte)(this->items).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        .arrays.groups_size_index & 0x3f);
  lVar11 = (hash & 0xff) * 4;
  uVar15 = (&UNK_003fea9c)[lVar11];
  uVar16 = (&UNK_003fea9d)[lVar11];
  uVar17 = (&UNK_003fea9e)[lVar11];
  bVar18 = (&UNK_003fea9f)[lVar11];
  uVar13 = (ulong)((uint)hash & 7);
  uVar10 = 0;
  uVar12 = pos0;
  uVar19 = uVar15;
  uVar20 = uVar16;
  uVar21 = uVar17;
  bVar22 = bVar18;
  uVar23 = uVar15;
  uVar24 = uVar16;
  uVar25 = uVar17;
  bVar26 = bVar18;
  uVar27 = uVar15;
  uVar28 = uVar16;
  uVar29 = uVar17;
  bVar30 = bVar18;
  do {
    pgVar2 = (this->items).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar12;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bVar9 = pgVar1->m[0xf].n;
    auVar14[0] = -(local_58 == uVar15);
    auVar14[1] = -(uStack_57 == uVar16);
    auVar14[2] = -(uStack_56 == uVar17);
    auVar14[3] = -(bStack_55 == bVar18);
    auVar14[4] = -(uStack_54 == uVar19);
    auVar14[5] = -(uStack_53 == uVar20);
    auVar14[6] = -(uStack_52 == uVar21);
    auVar14[7] = -(bStack_51 == bVar22);
    auVar14[8] = -(uStack_50 == uVar23);
    auVar14[9] = -(uStack_4f == uVar24);
    auVar14[10] = -(uStack_4e == uVar25);
    auVar14[0xb] = -(bStack_4d == bVar26);
    auVar14[0xc] = -(uStack_4c == uVar27);
    auVar14[0xd] = -(uStack_4b == uVar28);
    auVar14[0xe] = -(uStack_4a == uVar29);
    auVar14[0xf] = -(bVar9 == bVar30);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar9;
    if (uVar7 != 0) {
      ppVar3 = (this->items).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
               .arrays.elements_;
      local_88 = uVar13;
      local_80 = hash;
      local_78 = uVar12;
      local_70 = uVar10;
      local_68 = uVar15;
      uStack_67 = uVar16;
      uStack_66 = uVar17;
      bStack_65 = bVar18;
      uStack_64 = uVar19;
      uStack_63 = uVar20;
      uStack_62 = uVar21;
      bStack_61 = bVar22;
      uStack_60 = uVar23;
      uStack_5f = uVar24;
      uStack_5e = uVar25;
      bStack_5d = bVar26;
      uStack_5c = uVar27;
      uStack_5b = uVar28;
      uStack_5a = uVar29;
      bStack_59 = bVar30;
      do {
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __rhs = ppVar3 + uVar12 * 0xf + (ulong)uVar5;
        bVar6 = std::type_index::operator==(&local_90,&__rhs->first);
        if (bVar6) goto LAB_0022553f;
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
      bVar9 = pgVar2[uVar12].m[0xf].n;
      hash = local_80;
      uVar10 = local_70;
      uVar12 = local_78;
      uVar13 = local_88;
      uVar15 = local_68;
      uVar16 = uStack_67;
      uVar17 = uStack_66;
      bVar18 = bStack_65;
      uVar19 = uStack_64;
      uVar20 = uStack_63;
      uVar21 = uStack_62;
      bVar22 = bStack_61;
      uVar23 = uStack_60;
      uVar24 = uStack_5f;
      uVar25 = uStack_5e;
      bVar26 = bStack_5d;
      uVar27 = uStack_5c;
      uVar28 = uStack_5b;
      uVar29 = uStack_5a;
      bVar30 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar13] & bVar9) == 0) break;
    uVar4 = (this->items).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            .arrays.groups_size_mask;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & uVar4;
  } while (uVar10 <= uVar4);
  if ((this->items).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
      .size_ctrl.size <
      (this->items).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,pos0,hash,&local_91,&local_90);
    __rhs = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,hash,&local_91,&local_90);
    __rhs = local_48.p;
  }
LAB_0022553f:
  if ((__rhs->second)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    std::any::emplace<slang::ast::CompilationOptions>(&__rhs->second);
  }
  pCVar8 = (CompilationOptions *)std::__any_caster<slang::ast::CompilationOptions>(&__rhs->second);
  return pCVar8;
}

Assistant:

T& insertOrGet() {
        auto& item = items[SLANG_TYPEOF(T)];
        if (!item.has_value())
            item.template emplace<T>();
        return *std::any_cast<T>(&item);
    }